

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  char *text;
  ImGuiStyle *pIVar4;
  ImVec2 IVar5;
  float fStack_18;
  int local_14;
  int column_n;
  int columns_count;
  float row_height;
  
  column_n = (int)GetTextLineHeight();
  iVar2 = TableGetColumnCount();
  for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
    uVar3 = TableGetColumnFlags(local_14);
    if ((uVar3 & 0x100000) != 0) {
      text = TableGetColumnName(local_14);
      IVar5 = CalcTextSize(text,(char *)0x0,false,-1.0);
      fStack_18 = IVar5.y;
      column_n = (int)ImMax<float>((float)column_n,fStack_18);
    }
  }
  pIVar4 = GetStyle();
  fVar1 = (pIVar4->CellPadding).y;
  return fVar1 + fVar1 + (float)column_n;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
        if (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_IsEnabled)
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}